

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_face_rsn(REF_GEOM ref_geom,REF_INT faceid,REF_DBL *uv,REF_DBL *r,REF_DBL *s,REF_DBL *n)

{
  REF_STATUS ref_private_macro_code_raise;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL drsduv [4];
  REF_DBL dxyz_dtuv [15];
  REF_DBL local_58;
  REF_DBL xyz [3];
  REF_DBL *n_local;
  REF_DBL *s_local;
  REF_DBL *r_local;
  REF_DBL *uv_local;
  REF_INT faceid_local;
  REF_GEOM ref_geom_local;
  
  xyz[2] = (REF_DBL)n;
  ref_geom_local._4_4_ = ref_egads_eval_at(ref_geom,2,faceid,uv,&local_58,drsduv + 3);
  if (ref_geom_local._4_4_ == 0) {
    ref_geom_local._4_4_ =
         ref_geom_uv_rsn(drsduv + 3,r,s,(REF_DBL *)xyz[2],(REF_DBL *)&ref_private_macro_code_raise);
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x6b3,
           "ref_geom_face_rsn",(ulong)ref_geom_local._4_4_,"eval");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_face_rsn(REF_GEOM ref_geom, REF_INT faceid,
                                     REF_DBL *uv, REF_DBL *r, REF_DBL *s,
                                     REF_DBL *n) {
  REF_DBL xyz[3];
  REF_DBL dxyz_dtuv[15];
  REF_DBL drsduv[4];
  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, uv, xyz, dxyz_dtuv),
      "eval");
  RAISE(ref_geom_uv_rsn(dxyz_dtuv, r, s, n, drsduv));
  return REF_SUCCESS;
}